

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minipointcounter_test.cpp
# Opt level: O0

Utest * __thiscall
TEST_MinipointCounterTest_OwnWindPair_TestShell::createTest
          (TEST_MinipointCounterTest_OwnWindPair_TestShell *this)

{
  TEST_MinipointCounterTest_OwnWindPair_Test *this_00;
  char *in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  TEST_MinipointCounterTest_OwnWindPair_TestShell *this_local;
  
  this_00 = (TEST_MinipointCounterTest_OwnWindPair_Test *)
            operator_new(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,0);
  TEST_MinipointCounterTest_OwnWindPair_Test::TEST_MinipointCounterTest_OwnWindPair_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(MinipointCounterTest, OwnWindPair)
{
	s.setRoundWind(Tile::EastWind);
	s.setSeatWind(Tile::SouthWind);

	addPair(Tile::SouthWind);
	addOpenNoPointsHandWithoutPair();
	s.winByDiscard();

	CHECK_EQUAL(22, m.total(false));
}